

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_cast.hpp
# Opt level: O0

bool boost::unit_test::utils::string_as<unsigned_long>(const_string *str,unsigned_long *res)

{
  byte bVar1;
  iterator __end;
  iterator __beg;
  ulong *in_RSI;
  basic_cstring<const_char> *in_RDI;
  istringstream buff;
  byte local_1ea;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  undefined1 local_1b1 [33];
  istringstream local_190 [384];
  ulong *local_10;
  
  local_10 = in_RSI;
  __end = basic_cstring<const_char>::begin(in_RDI);
  __beg = basic_cstring<const_char>::end(in_RDI);
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<char_const*,void>(this,__beg,__end,(allocator<char> *)in_RDI);
  std::__cxx11::istringstream::istringstream(local_190,(string *)(local_1b1 + 1),_S_in);
  std::__cxx11::string::~string((string *)(local_1b1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_1b1);
  std::istream::operator>>((istream *)local_190,local_10);
  bVar1 = std::ios::fail();
  local_1ea = 0;
  if ((bVar1 & 1) == 0) {
    local_1ea = std::ios::eof();
  }
  std::__cxx11::istringstream::~istringstream(local_190);
  return (bool)(local_1ea & 1);
}

Assistant:

inline bool
string_as( const_string str, T& res )
{
    std::istringstream buff( std::string( str.begin(), str.end() ) );
    buff >> res;

    return !buff.fail() && buff.eof();
}